

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O0

void __thiscall
QGraphicsProxyWidgetPrivate::updateProxyGeometryFromWidget(QGraphicsProxyWidgetPrivate *this)

{
  bool bVar1;
  QGraphicsProxyWidget *this_00;
  QWidget *pQVar2;
  QWidget *this_01;
  QGraphicsProxyWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsProxyWidget *proxyParent;
  QWidget *parentWidget;
  QGraphicsProxyWidget *q;
  QRectF widgetGeometry;
  QWidget *in_stack_ffffffffffffff28;
  QRect *in_stack_ffffffffffffff38;
  QRectF *in_stack_ffffffffffffff40;
  QGraphicsProxyWidgetPrivate *this_02;
  QWidget *in_stack_ffffffffffffff88;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = in_RDI;
  this_00 = q_func(in_RDI);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x9b96d6);
  if (bVar1) {
    local_28 = 0xffffffffffffffff;
    local_20 = 0xffffffffffffffff;
    local_18 = 0xffffffffffffffff;
    local_10 = 0xffffffffffffffff;
    pQVar2 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9b972c);
    QWidget::geometry(pQVar2);
    QRectF::QRectF(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9b9755);
    pQVar2 = QWidget::parentWidget((QWidget *)0x9b975d);
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9b9773);
    bVar1 = QWidget::isWindow((QWidget *)in_RDI);
    if ((bVar1) && (pQVar2 != (QWidget *)0x0)) {
      QGraphicsItem::parentWidget((QGraphicsItem *)this_02);
      this_01 = (QWidget *)qobject_cast<QGraphicsProxyWidget*>((QObject *)0x9b97af);
      if (this_01 != (QWidget *)0x0) {
        QGraphicsProxyWidget::subWidgetRect(this_00,in_stack_ffffffffffffff88);
        in_stack_ffffffffffffff28 = pQVar2;
        QRectF::topLeft((QRectF *)this_01);
        pQVar2 = in_stack_ffffffffffffff28;
        QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9b9808);
        QWidget::pos(this_01);
        QWidget::mapFromGlobal(pQVar2,(QPoint *)this_01);
        QPointF::QPointF((QPointF *)in_RDI,(QPoint *)in_stack_ffffffffffffff28);
        ::operator+((QPointF *)this_01,(QPointF *)in_RDI);
        QRectF::moveTo((QRectF *)in_RDI,(QPointF *)in_stack_ffffffffffffff28);
      }
    }
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9b9883);
    QWidget::size(in_stack_ffffffffffffff28);
    bVar1 = QSize::isValid((QSize *)pQVar2);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      pQVar2 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9b98b3);
      (**(code **)(*(long *)pQVar2 + 0x70))();
      QSizeF::QSizeF((QSizeF *)in_RDI,(QSize *)in_stack_ffffffffffffff28);
      QRectF::setSize((QRectF *)in_RDI,(QSizeF *)in_stack_ffffffffffffff28);
    }
    *(ushort *)&in_RDI->field_0x244 = *(ushort *)&in_RDI->field_0x244 & 0xfffc | 2;
    *(ushort *)&in_RDI->field_0x244 = *(ushort *)&in_RDI->field_0x244 & 0xfff3 | 8;
    (**(code **)(*(long *)&(this_00->super_QGraphicsWidget).super_QGraphicsObject + 0x60))
              (this_00,&local_28);
    *(ushort *)&in_RDI->field_0x244 = *(ushort *)&in_RDI->field_0x244 & 0xfffc;
    *(ushort *)&in_RDI->field_0x244 = *(ushort *)&in_RDI->field_0x244 & 0xfff3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsProxyWidgetPrivate::updateProxyGeometryFromWidget()
{
    Q_Q(QGraphicsProxyWidget);
    if (!widget)
        return;

    QRectF widgetGeometry = widget->geometry();
    QWidget *parentWidget = widget->parentWidget();
    if (widget->isWindow()) {
        QGraphicsProxyWidget *proxyParent = nullptr;
        if (parentWidget && (proxyParent = qobject_cast<QGraphicsProxyWidget *>(q->parentWidget()))) {
            // Nested window proxy (e.g., combobox popup), map widget to the
            // parent widget's global coordinates, and map that to the parent
            // proxy's child coordinates.
            widgetGeometry.moveTo(proxyParent->subWidgetRect(parentWidget).topLeft()
                                  + parentWidget->mapFromGlobal(widget->pos()));
        }
    }

    // Adjust to size hint if the widget has never been resized.
    if (!widget->size().isValid())
        widgetGeometry.setSize(widget->sizeHint());

    // Assign new geometry.
    posChangeMode = QGraphicsProxyWidgetPrivate::WidgetToProxyMode;
    sizeChangeMode = QGraphicsProxyWidgetPrivate::WidgetToProxyMode;
    q->setGeometry(widgetGeometry);
    posChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
    sizeChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
}